

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O0

ssize_t __thiscall
QHeaderViewPrivate::read(QHeaderViewPrivate *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  Status SVar2;
  int iVar3;
  qsizetype qVar4;
  const_reference pSVar5;
  reference pSVar6;
  SectionItem *pSVar7;
  undefined4 in_register_00000034;
  QDataStream *this_00;
  long in_FS_OFFSET;
  int insertLength;
  int insertCount;
  int i;
  int currentCount;
  HeaderMode impMode;
  SectionItem *section;
  add_const_t<QList<QHeaderViewPrivate::SectionItem>_> *__range1;
  int sectionItemsLengthTotal;
  int n;
  int count;
  int u;
  QHeaderView *q;
  SectionItem section_1;
  int iHeaderMode;
  int inSortIndicatorClearable;
  int inLastSectionSize;
  bool tmpbool;
  int tmpint;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QHeaderViewPrivate::SectionItem> newSectionItems;
  int unusedSectionCount;
  QBitArray sectionHidden;
  QList<QHeaderViewPrivate::SectionItem> sectionItemsIn;
  int minimumSectionSizeIn;
  int defaultSectionSizeIn;
  int contentsSectionsIn;
  int stretchSectionsIn;
  bool cascadingResizingIn;
  bool stretchLastSectionIn;
  bool highlightSelectedIn;
  bool clickableSectionsIn;
  bool movableSectionsIn;
  QHash<int,_int> hiddenSectionSizeIn;
  QList<int> logicalIndicesIn;
  QList<int> visualIndicesIn;
  int lengthIn;
  bool sortIndicatorShownIn;
  int sortIndicatorSectionIn;
  int global;
  int align;
  int order;
  int orient;
  undefined4 in_stack_fffffffffffffe08;
  parameter_type in_stack_fffffffffffffe0c;
  QHeaderViewPrivate *in_stack_fffffffffffffe10;
  QHeaderViewPrivate *in_stack_fffffffffffffe18;
  QList<QHeaderViewPrivate::SectionItem> *n_00;
  QHeaderViewPrivate *in_stack_fffffffffffffe20;
  QAbstractItemModel *in_stack_fffffffffffffe28;
  int local_1cc;
  int local_18c;
  int local_16c;
  int local_168;
  int local_160;
  undefined1 local_139;
  SectionItem local_138;
  QPersistentModelIndex local_130 [3];
  QPersistentModelIndex local_118 [3];
  HeaderMode local_fc;
  int local_f8;
  int local_f4;
  bool local_ed;
  int local_ec;
  QFlag local_e8;
  Int local_e4;
  SectionItem *local_e0;
  const_iterator local_d8;
  const_iterator local_d0;
  QList<QHeaderViewPrivate::SectionItem> local_c8;
  int local_ac;
  QBitArray local_a8;
  QList<QHeaderViewPrivate::SectionItem> local_90;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  bool local_65;
  bool local_64;
  bool local_63;
  bool local_62;
  bool local_61;
  QHash<int,_int> local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  int local_24;
  bool local_1d;
  int local_1c;
  ResizeMode local_18;
  int local_14;
  SortOrder local_10;
  Orientation local_c;
  long local_8;
  
  this_00 = (QDataStream *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(this);
  local_c = 0xaaaaaaaa;
  local_10 = 0xaaaaaaaa;
  local_14 = -0x55555556;
  local_18 = 0xaaaaaaaa;
  local_1c = -0x55555556;
  local_1d = true;
  local_24 = -0x55555556;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  QList<int>::QList((QList<int> *)0x839e2a);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  QList<int>::QList((QList<int> *)0x839e64);
  local_60.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QHash<int,_int>::QHash(&local_60);
  local_61 = true;
  local_62 = true;
  local_63 = true;
  local_64 = true;
  local_65 = true;
  local_6c = -0x55555556;
  local_70 = -0x55555556;
  local_74 = -0x55555556;
  local_78 = -0x55555556;
  local_90.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_90.d.ptr = (SectionItem *)&DAT_aaaaaaaaaaaaaaaa;
  local_90.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QHeaderViewPrivate::SectionItem>::QList((QList<QHeaderViewPrivate::SectionItem> *)0x839f0e);
  QDataStream::operator>>(this_00,(int *)&local_c);
  QDataStream::operator>>(this_00,(int *)&local_10);
  QDataStream::operator>>(this_00,&local_1c);
  QDataStream::operator>>(this_00,&local_1d);
  ::operator>>((QDataStream *)in_stack_fffffffffffffe10,
               (QList<int> *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  ::operator>>((QDataStream *)in_stack_fffffffffffffe10,
               (QList<int> *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  local_a8.d.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QBitArray::QBitArray((QBitArray *)0x839fc6);
  ::operator>>(this_00,&local_a8);
  ::operator>>((QDataStream *)in_stack_fffffffffffffe10,
               (QHash<int,_int> *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  QDataStream::operator>>(this_00,&local_24);
  local_ac = -0x55555556;
  QDataStream::operator>>(this_00,&local_ac);
  SVar2 = QDataStream::status(this_00);
  if ((SVar2 != Ok) || (local_24 < 0)) {
    local_139 = 0;
    goto LAB_0083aa9a;
  }
  QDataStream::operator>>(this_00,&local_61);
  QDataStream::operator>>(this_00,&local_62);
  QDataStream::operator>>(this_00,&local_63);
  QDataStream::operator>>(this_00,&local_64);
  QDataStream::operator>>(this_00,&local_65);
  QDataStream::operator>>(this_00,&local_6c);
  QDataStream::operator>>(this_00,&local_70);
  QDataStream::operator>>(this_00,&local_74);
  QDataStream::operator>>(this_00,&local_78);
  QDataStream::operator>>(this_00,&local_14);
  QDataStream::operator>>(this_00,(int *)&local_18);
  if (((int)local_18 < 0) || (3 < (int)local_18)) {
    local_139 = 0;
    goto LAB_0083aa9a;
  }
  if ((local_14 < 0) || (0x1e0 < local_14)) {
    local_139 = 0;
    goto LAB_0083aa9a;
  }
  ::operator>>((QDataStream *)in_stack_fffffffffffffe10,
               (QList<QHeaderViewPrivate::SectionItem> *)
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  local_c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d.ptr = (SectionItem *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QHeaderViewPrivate::SectionItem>::QList((QList<QHeaderViewPrivate::SectionItem> *)0x83a1ea);
  for (local_160 = 0; qVar4 = QList<QHeaderViewPrivate::SectionItem>::size(&local_90),
      local_160 < qVar4; local_160 = local_160 + 1) {
    pSVar5 = QList<QHeaderViewPrivate::SectionItem>::at
                       ((QList<QHeaderViewPrivate::SectionItem> *)in_stack_fffffffffffffe10,
                        CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    iVar3 = (pSVar5->field_4).calculated_startpos;
    if (1 < iVar3) {
      pSVar6 = QList<QHeaderViewPrivate::SectionItem>::operator[]
                         ((QList<QHeaderViewPrivate::SectionItem> *)in_stack_fffffffffffffe10,
                          CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      *(uint *)pSVar6 =
           *(uint *)pSVar6 & 0xfff00000 |
           (uint)((long)(ulong)(*(uint *)pSVar6 & 0xfffff) / (long)iVar3) & 0xfffff;
    }
    for (local_168 = 0; local_168 < iVar3; local_168 = local_168 + 1) {
      QList<QHeaderViewPrivate::SectionItem>::operator[]
                ((QList<QHeaderViewPrivate::SectionItem> *)in_stack_fffffffffffffe10,
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      QList<QHeaderViewPrivate::SectionItem>::append
                ((QList<QHeaderViewPrivate::SectionItem> *)in_stack_fffffffffffffe10,
                 (parameter_type)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    }
  }
  local_16c = 0;
  local_d0.i = (SectionItem *)&DAT_aaaaaaaaaaaaaaaa;
  local_d0 = QList<QHeaderViewPrivate::SectionItem>::begin
                       ((QList<QHeaderViewPrivate::SectionItem> *)in_stack_fffffffffffffe10);
  local_d8.i = (SectionItem *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8 = QList<QHeaderViewPrivate::SectionItem>::end
                       ((QList<QHeaderViewPrivate::SectionItem> *)in_stack_fffffffffffffe10);
  while( true ) {
    local_e0 = local_d8.i;
    bVar1 = QList<QHeaderViewPrivate::SectionItem>::const_iterator::operator!=(&local_d0,local_d8);
    if (!bVar1) break;
    pSVar7 = QList<QHeaderViewPrivate::SectionItem>::const_iterator::operator*(&local_d0);
    local_16c = (*(uint *)pSVar7 & 0xfffff) + local_16c;
    QList<QHeaderViewPrivate::SectionItem>::const_iterator::operator++(&local_d0);
  }
  if ((local_16c == local_24) ||
     (qVar4 = QList<QHeaderViewPrivate::SectionItem>::size(&local_c8), qVar4 < 1)) {
    this->headerMode = FlexibleWithSectionMemoryUsage;
    this->orientation = local_c;
    this->sortIndicatorOrder = local_10;
    this->sortIndicatorSection = local_1c;
    this->sortIndicatorShown = (bool)(local_1d & 1);
    QList<int>::operator=
              ((QList<int> *)in_stack_fffffffffffffe10,
               (QList<int> *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    QList<int>::operator=
              ((QList<int> *)in_stack_fffffffffffffe10,
               (QList<int> *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    QHash<int,_int>::operator=
              ((QHash<int,_int> *)in_stack_fffffffffffffe20,
               (QHash<int,_int> *)in_stack_fffffffffffffe18);
    this->length = local_24;
    this->movableSections = (bool)(local_61 & 1);
    this->clickableSections = (bool)(local_62 & 1);
    this->highlightSelected = (bool)(local_63 & 1);
    this->stretchLastSection = (bool)(local_64 & 1);
    this->cascadingResizing = (bool)(local_65 & 1);
    this->stretchSections = local_6c;
    this->contentsSections = local_70;
    this->defaultSectionSize = local_74;
    this->minimumSectionSize = local_78;
    QFlag::QFlag(&local_e8,local_14);
    QFlags<Qt::AlignmentFlag>::QFlagsStorageHelper
              ((QFlags<Qt::AlignmentFlag> *)
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (QFlag)(int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
    (this->defaultAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = local_e4;
    this->globalResizeMode = local_18;
    QList<QHeaderViewPrivate::SectionItem>::operator=
              ((QList<QHeaderViewPrivate::SectionItem> *)in_stack_fffffffffffffe10,
               (QList<QHeaderViewPrivate::SectionItem> *)
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    setHiddenSectionsFromBitVector(in_stack_fffffffffffffe20,(QBitArray *)in_stack_fffffffffffffe18)
    ;
    recalcSectionStartPos(in_stack_fffffffffffffe20);
    local_ec = -0x55555556;
    QDataStream::operator>>(this_00,&local_ec);
    SVar2 = QDataStream::status(this_00);
    if (SVar2 == Ok) {
      this->resizeContentsPrecision = local_ec;
    }
    local_ed = true;
    QDataStream::operator>>(this_00,&local_ed);
    SVar2 = QDataStream::status(this_00);
    if ((SVar2 == Ok) &&
       (this->customDefaultSectionSize = (bool)(local_ed & 1),
       (this->customDefaultSectionSize & 1U) == 0)) {
      updateDefaultSectionSizeFromStyle(in_stack_fffffffffffffe10);
    }
    this->lastSectionSize = -1;
    local_f4 = -0x55555556;
    QDataStream::operator>>(this_00,&local_f4);
    SVar2 = QDataStream::status(this_00);
    if (SVar2 == Ok) {
      this->lastSectionSize = local_f4;
    }
    this->lastSectionLogicalIdx = -1;
    if ((this->stretchLastSection & 1U) != 0) {
      lastVisibleVisualIndex(in_stack_fffffffffffffe18);
      iVar3 = QHeaderView::logicalIndex
                        ((QHeaderView *)in_stack_fffffffffffffe18,
                         (int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
      this->lastSectionLogicalIdx = iVar3;
      doDelayedResizeSections(in_stack_fffffffffffffe10);
    }
    local_f8 = -0x55555556;
    QDataStream::operator>>(this_00,&local_f8);
    SVar2 = QDataStream::status(this_00);
    if (SVar2 == Ok) {
      this->sortIndicatorClearable = local_f8 != 0;
    }
    QDataStream::operator>>(this_00,&this->countInNoSectionItemsMode);
    local_fc = 0xaaaaaaaa;
    QDataStream::operator>>(this_00,(int *)&local_fc);
    SVar2 = QDataStream::status(this_00);
    if (SVar2 != Ok) {
      local_fc = FlexibleWithSectionMemoryUsage;
    }
    if ((local_fc == FlexibleWithSectionMemoryUsage) || (local_fc == InitialNoSectionMemoryUsage)) {
      this->headerMode = local_fc;
    }
    else if ((this->countInNoSectionItemsMode < 1) ||
            (bVar1 = QList<QHeaderViewPrivate::SectionItem>::isEmpty
                               ((QList<QHeaderViewPrivate::SectionItem> *)0x83a7e6), !bVar1)) {
      if ((0 < this->countInNoSectionItemsMode) ||
         (bVar1 = QList<QHeaderViewPrivate::SectionItem>::isEmpty
                            ((QList<QHeaderViewPrivate::SectionItem> *)0x83a81d), bVar1)) {
        this->headerMode = FlexibleWithSectionMemoryUsage;
        local_139 = 0;
        goto LAB_0083aa8d;
      }
      this->headerMode = FlexibleWithSectionMemoryUsage;
    }
    else {
      this->headerMode = InitialNoSectionMemoryUsage;
    }
    if (local_c == Horizontal) {
      in_stack_fffffffffffffe28 = (this->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_118);
      local_1cc = (**(code **)(*(long *)in_stack_fffffffffffffe28 + 0x80))
                            (in_stack_fffffffffffffe28,local_118);
    }
    else {
      in_stack_fffffffffffffe20 = (QHeaderViewPrivate *)(this->super_QAbstractItemViewPrivate).model
      ;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_130);
      local_1cc = (**(code **)(*(long *)&(in_stack_fffffffffffffe20->super_QAbstractItemViewPrivate)
                                         .super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                         super_QWidgetPrivate + 0x78))
                            (in_stack_fffffffffffffe20,local_130);
    }
    qVar4 = QList<QHeaderViewPrivate::SectionItem>::size(&this->sectionItems);
    if (qVar4 < local_1cc) {
      bVar1 = noSectionMemoryUsage(this);
      if (bVar1) {
        this->countInNoSectionItemsMode = (long)local_1cc;
        this->length = this->defaultSectionSize * (int)this->countInNoSectionItemsMode;
      }
      else {
        bVar1 = QList<int>::isEmpty((QList<int> *)0x83a953);
        if ((!bVar1) && (bVar1 = QList<int>::isEmpty((QList<int> *)0x83a964), !bVar1)) {
          qVar4 = QList<QHeaderViewPrivate::SectionItem>::size(&this->sectionItems);
          for (local_18c = (int)qVar4; local_18c < local_1cc; local_18c = local_18c + 1) {
            QList<int>::append((QList<int> *)0x83a99c,in_stack_fffffffffffffe0c);
            QList<int>::append((QList<int> *)0x83a9b1,in_stack_fffffffffffffe0c);
          }
        }
        in_stack_fffffffffffffe10 = (QHeaderViewPrivate *)(long)local_1cc;
        qVar4 = QList<QHeaderViewPrivate::SectionItem>::size(&this->sectionItems);
        local_24 = local_74 * ((int)in_stack_fffffffffffffe10 - (int)qVar4) + local_24;
        local_138 = (SectionItem)&DAT_aaaaaaaaaaaaaaaa;
        SectionItem::SectionItem(&local_138,local_74,this->globalResizeMode);
        n_00 = &this->sectionItems;
        QList<QHeaderViewPrivate::SectionItem>::size(&this->sectionItems);
        QList<QHeaderViewPrivate::SectionItem>::insert
                  ((QList<QHeaderViewPrivate::SectionItem> *)in_stack_fffffffffffffe28,
                   (qsizetype)in_stack_fffffffffffffe20,(qsizetype)n_00,
                   (parameter_type)in_stack_fffffffffffffe10);
      }
    }
    local_139 = 1;
  }
  else {
    local_139 = 0;
  }
LAB_0083aa8d:
  QList<QHeaderViewPrivate::SectionItem>::~QList((QList<QHeaderViewPrivate::SectionItem> *)0x83aa9a)
  ;
LAB_0083aa9a:
  QBitArray::~QBitArray((QBitArray *)0x83aaa7);
  QList<QHeaderViewPrivate::SectionItem>::~QList((QList<QHeaderViewPrivate::SectionItem> *)0x83aab4)
  ;
  QHash<int,_int>::~QHash((QHash<int,_int> *)in_stack_fffffffffffffe10);
  QList<int>::~QList((QList<int> *)0x83aace);
  QList<int>::~QList((QList<int> *)0x83aadb);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_139);
}

Assistant:

bool QHeaderViewPrivate::read(QDataStream &in)
{
    Q_Q(QHeaderView);
    int orient, order, align, global;
    int sortIndicatorSectionIn;
    bool sortIndicatorShownIn;
    int lengthIn;
    QList<int> visualIndicesIn;
    QList<int> logicalIndicesIn;
    QHash<int, int> hiddenSectionSizeIn;
    bool movableSectionsIn;
    bool clickableSectionsIn;
    bool highlightSelectedIn;
    bool stretchLastSectionIn;
    bool cascadingResizingIn;
    int stretchSectionsIn;
    int contentsSectionsIn;
    int defaultSectionSizeIn;
    int minimumSectionSizeIn;
    QList<SectionItem> sectionItemsIn;

    in >> orient;
    in >> order;

    in >> sortIndicatorSectionIn;
    in >> sortIndicatorShownIn;

    in >> visualIndicesIn;
    in >> logicalIndicesIn;

    QBitArray sectionHidden;
    in >> sectionHidden;
    in >> hiddenSectionSizeIn;
    in >> lengthIn;

    int unusedSectionCount; // For compatibility
    in >> unusedSectionCount;

    if (in.status() != QDataStream::Ok || lengthIn < 0)
        return false;

    in >> movableSectionsIn;
    in >> clickableSectionsIn;
    in >> highlightSelectedIn;
    in >> stretchLastSectionIn;
    in >> cascadingResizingIn;
    in >> stretchSectionsIn;
    in >> contentsSectionsIn;
    in >> defaultSectionSizeIn;
    in >> minimumSectionSizeIn;

    in >> align;

    in >> global;

    // Check parameter consistency
    // Global orientation out of bounds?
    if (global < 0 || global > QHeaderView::ResizeToContents)
        return false;

    // Alignment out of bounds?
    if (align < 0 || align > Qt::AlignVertical_Mask)
        return false;

    in >> sectionItemsIn;


    // In Qt4 we had a vector of spans where one span could hold information on more sections.
    // Now we have an itemvector where one items contains information about one section
    // For backward compatibility with Qt4 we do the following
    QList<SectionItem> newSectionItems;
    for (int u = 0; u < sectionItemsIn.size(); ++u) {
        int count = sectionItemsIn.at(u).tmpDataStreamSectionCount;
        if (count > 1)
            sectionItemsIn[u].size /= count;
        for (int n = 0; n < count; ++n)
            newSectionItems.append(sectionItemsIn[u]);
    }

    int sectionItemsLengthTotal = 0;
    for (const SectionItem &section : std::as_const(newSectionItems))
        sectionItemsLengthTotal += section.size;

    if (sectionItemsLengthTotal != lengthIn && newSectionItems.size() > 0)
        return false;

    // We don't want to do an actual change in normal mode.
    // (Hence we have already set up sections etc)
    headerMode = HeaderMode::FlexibleWithSectionMemoryUsage;

    orientation = static_cast<Qt::Orientation>(orient);
    sortIndicatorOrder = static_cast<Qt::SortOrder>(order);
    sortIndicatorSection = sortIndicatorSectionIn;
    sortIndicatorShown = sortIndicatorShownIn;
    visualIndices = visualIndicesIn;
    logicalIndices = logicalIndicesIn;
    hiddenSectionSize = hiddenSectionSizeIn;
    length = lengthIn;

    movableSections = movableSectionsIn;
    clickableSections = clickableSectionsIn;
    highlightSelected = highlightSelectedIn;
    stretchLastSection = stretchLastSectionIn;
    cascadingResizing = cascadingResizingIn;
    stretchSections = stretchSectionsIn;
    contentsSections = contentsSectionsIn;
    defaultSectionSize = defaultSectionSizeIn;
    minimumSectionSize = minimumSectionSizeIn;

    defaultAlignment = Qt::Alignment(align);
    globalResizeMode = static_cast<QHeaderView::ResizeMode>(global);

    sectionItems = newSectionItems;
    setHiddenSectionsFromBitVector(sectionHidden);
    recalcSectionStartPos();

    int tmpint;
    in >> tmpint;
    if (in.status() == QDataStream::Ok)  // we haven't read past end
        resizeContentsPrecision = tmpint;

    bool tmpbool;
    in >> tmpbool;
    if (in.status() == QDataStream::Ok) {  // we haven't read past end
        customDefaultSectionSize = tmpbool;
        if (!customDefaultSectionSize)
            updateDefaultSectionSizeFromStyle();
    }

    lastSectionSize = -1;
    int inLastSectionSize;
    in >> inLastSectionSize;
    if (in.status() == QDataStream::Ok)
        lastSectionSize = inLastSectionSize;

    lastSectionLogicalIdx = -1;
    if (stretchLastSection) {
        lastSectionLogicalIdx = q->logicalIndex(lastVisibleVisualIndex());
        doDelayedResizeSections();
    }

    int inSortIndicatorClearable;
    in >> inSortIndicatorClearable;
    if (in.status() == QDataStream::Ok)  // we haven't read past end
        sortIndicatorClearable = inSortIndicatorClearable;

    in >> countInNoSectionItemsMode;
    int iHeaderMode;

    in >> iHeaderMode;
    // On any failure (especially reading past end) we consider mode to be normal by default.
    if (in.status() != QDataStream::Ok) {
        iHeaderMode = static_cast<int>(HeaderMode::FlexibleWithSectionMemoryUsage);
    }

    const HeaderMode impMode = static_cast<HeaderMode>(iHeaderMode);
    if (impMode == HeaderMode::FlexibleWithSectionMemoryUsage || impMode == HeaderMode::InitialNoSectionMemoryUsage) {
        headerMode = impMode;
    }
    else {
        // Then it must be from a newer version with a new enum value and we simply
        // take the best match.
        if (countInNoSectionItemsMode > 0 && sectionItems.isEmpty()) {
            headerMode = HeaderMode::InitialNoSectionMemoryUsage;
        }
        else if (countInNoSectionItemsMode <= 0 && !sectionItems.isEmpty()) {
            headerMode = HeaderMode::FlexibleWithSectionMemoryUsage;
        }
        else {
            // We shouldn't end up with both sections and a section count (countInNoSectionItemsMode) > 0.
            headerMode = HeaderMode::FlexibleWithSectionMemoryUsage;
            return false;
        }
    }

    // Append items from model.
    const int currentCount = (orient == Qt::Horizontal ? model->columnCount(root) : model->rowCount(root));
    if (sectionItems.size() < currentCount) {

        if (noSectionMemoryUsage()) {
            countInNoSectionItemsMode = currentCount;
            length = defaultSectionSize * countInNoSectionItemsMode;
        } else {
             // we have sections not in the saved state, give them default settings
            if (!visualIndicesIn.isEmpty() && !logicalIndicesIn.isEmpty()) {
                for (int i = sectionItems.size(); i < currentCount; ++i) {
                    visualIndices.append(i);
                    logicalIndices.append(i);
                }
            }
            const int insertCount = currentCount - sectionItems.size();
            const int insertLength = defaultSectionSizeIn * insertCount;
            lengthIn += insertLength;
            SectionItem section(defaultSectionSizeIn, globalResizeMode);
            sectionItems.insert(sectionItems.size(), insertCount, section); // append
        }
    }
    return true;
}